

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# software_interrupt.c
# Opt level: O0

void software_interrupt(arm7tdmi_t *state,uint8_t comment)

{
  uint uVar1;
  int iVar2;
  byte in_SIL;
  long in_RDI;
  status_register_t cpsr;
  uint32_t adjusted_pc;
  uint32_t value;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  iVar2 = 8;
  if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) != 0) {
    iVar2 = 4;
  }
  uVar1 = *(int *)(in_RDI + 0xb0) - iVar2;
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",(ulong)uVar1,
           (ulong)in_SIL,SWI_NAMES[in_SIL]);
  }
  value = *(uint32_t *)(in_RDI + 0xb4);
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffe0 | 0x13;
  set_spsr((arm7tdmi_t *)CONCAT44(uVar3,uVar1),value);
  iVar2 = 4;
  if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) != 0) {
    iVar2 = 2;
  }
  *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xb0) - iVar2;
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffdf;
  *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffff7f | 0x80;
  set_pc((arm7tdmi_t *)CONCAT44(uVar3,uVar1),value);
  return;
}

Assistant:

void software_interrupt(arm7tdmi_t* state, byte comment) {
    word adjusted_pc = state->pc - (state->cpsr.thumb ? 4 : 8);
    logwarn("adjusted pc: 0x%08X: SWI: 0x%X - %s", adjusted_pc, comment, SWI_NAMES[comment])
    status_register_t cpsr = state->cpsr;
    state->cpsr.mode = MODE_SUPERVISOR;
    set_spsr(state, cpsr.raw);

    state->lr_svc = state->pc - (state->cpsr.thumb ? 2 : 4);

    state->cpsr.thumb = 0;
    state->cpsr.disable_irq = 1;

    set_pc(state, 0x8); // SVC handler
}